

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O1

archive_entry * archive_entry_partial_links(archive_entry_linkresolver *res,uint *links)

{
  links_entry_conflict *plVar1;
  archive_entry *paVar2;
  
  if (res->spare != (links_entry_conflict *)0x0) {
    archive_entry_free(res->spare->canonical);
    archive_entry_free(res->spare->entry);
    free(res->spare);
    res->spare = (links_entry_conflict *)0x0;
  }
  plVar1 = next_entry(res,2);
  if (plVar1 == (links_entry_conflict *)0x0) {
    if (links != (uint *)0x0) {
      *links = 0;
    }
    paVar2 = (archive_entry *)0x0;
  }
  else {
    paVar2 = plVar1->canonical;
    if (links != (uint *)0x0) {
      *links = plVar1->links;
    }
    plVar1->canonical = (archive_entry *)0x0;
  }
  return paVar2;
}

Assistant:

struct archive_entry *
archive_entry_partial_links(struct archive_entry_linkresolver *res,
    unsigned int *links)
{
	struct archive_entry	*e;
	struct links_entry	*le;

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	le = next_entry(res, NEXT_ENTRY_PARTIAL);
	if (le != NULL) {
		e = le->canonical;
		if (links != NULL)
			*links = le->links;
		le->canonical = NULL;
	} else {
		e = NULL;
		if (links != NULL)
			*links = 0;
	}
	return (e);
}